

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O3

void opensshcert_openssh_blob(ssh_key *key,BinarySink *bs)

{
  ptrlen *ppVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  void *pvVar5;
  size_t sVar6;
  _Bool _Var7;
  strbuf *psVar8;
  long lVar9;
  long lVar10;
  size_t i;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  ulong n;
  ptrlen pl1;
  ptrlen pVar14;
  BinarySource basesrc [1];
  void *local_88;
  BinarySource local_58;
  
  pvVar3 = key->vt->extra;
  psVar8 = strbuf_new();
  (*key->vt->public_blob)(key,psVar8->binarysink_);
  BinarySink_put_stringsb(bs->binarysink_,psVar8);
  psVar8 = strbuf_new_nm();
  (**(code **)((key[-1].vt)->new_pub + 0x48))(key[-1].vt,psVar8->binarysink_);
  local_58.data = psVar8->u;
  local_58.len = psVar8->len;
  local_58.binarysource_ = &local_58;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  lVar4 = *(long *)((long)pvVar3 + 0x18);
  if (lVar4 == 0) {
    local_88 = (void *)0x0;
    n = 0;
  }
  else {
    lVar10 = *(long *)((long)pvVar3 + 0x10);
    lVar9 = 0;
    uVar13 = 0;
    do {
      n = (ulong)(*(int *)(lVar10 + lVar9 * 4) + 1);
      if (n < uVar13) {
        n = uVar13;
      }
      lVar9 = lVar9 + 1;
      uVar13 = n;
    } while (lVar4 != lVar9);
    if (n == 0) {
      local_88 = (void *)0x0;
    }
    else {
      local_88 = saferealloc((void *)0x0,n,0x10);
      memset(local_88,0,n << 4);
    }
    lVar9 = 0;
    do {
      uVar2 = *(uint *)(lVar10 + lVar9 * 4);
      pVar14 = BinarySource_get_string(local_58.binarysource_);
      lVar11 = (ulong)uVar2 * 0x10;
      ppVar1 = (ptrlen *)((long)local_88 + lVar11);
      pvVar5 = *(void **)((long)local_88 + lVar11);
      if ((pvVar5 != (void *)0x0) &&
         (pl1.len = ppVar1->len, pl1.ptr = pvVar5, _Var7 = ptrlen_eq_ptrlen(pl1,pVar14), !_Var7))
      break;
      *ppVar1 = pVar14;
      lVar9 = lVar9 + 1;
    } while (lVar4 != lVar9);
  }
  sVar6 = *(size_t *)((long)pvVar3 + 0x28);
  if (sVar6 != 0) {
    lVar4 = *(long *)((long)pvVar3 + 0x20);
    sVar12 = 0;
    do {
      if (n == sVar12) {
        __assert_fail("i < bt->nparts",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/openssh-certs.c"
                      ,0xb5,"void blobtrans_write(BlobTransformer *, BinarySink *, blob_fmt)");
      }
      lVar10 = (ulong)*(uint *)(lVar4 + sVar12 * 4) * 0x10;
      pvVar3 = *(void **)((long)local_88 + lVar10);
      if (pvVar3 == (void *)0x0) {
        __assert_fail("part.ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/openssh-certs.c"
                      ,0xb7,"void blobtrans_write(BlobTransformer *, BinarySink *, blob_fmt)");
      }
      pVar14.len = *(size_t *)((long)local_88 + lVar10 + 8);
      pVar14.ptr = pvVar3;
      BinarySink_put_stringpl(bs->binarysink_,pVar14);
      sVar12 = sVar12 + 1;
    } while (sVar6 != sVar12);
  }
  safefree(local_88);
  strbuf_free(psVar8);
  return;
}

Assistant:

static void opensshcert_openssh_blob(ssh_key *key, BinarySink *bs)
{
    opensshcert_key *ck = container_of(key, opensshcert_key, sshk);
    const opensshcert_extra *extra = key->vt->extra;

    strbuf *cert = strbuf_new();
    ssh_key_public_blob(key, BinarySink_UPCAST(cert));
    put_stringsb(bs, cert);

    strbuf *baseossh = strbuf_new_nm();
    ssh_key_openssh_blob(ck->basekey, BinarySink_UPCAST(baseossh));
    BinarySource basesrc[1];
    BinarySource_BARE_INIT_PL(basesrc, ptrlen_from_strbuf(baseossh));

    BLOBTRANS_DECLARE(bt);
    blobtrans_read(bt, basesrc, extra->base_ossh_fmt);
    blobtrans_write(bt, bs, extra->cert_ossh_fmt);
    blobtrans_clear(bt);

    strbuf_free(baseossh);
}